

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cpp_properties::latin1_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cpp_properties *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *latin1_string)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char code_point;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __begin0;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *latin1_string_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *utf8;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __begin0._M_current = (char *)this;
  local_30 = boost::iterator_range_detail::
             iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             ::begin((iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                      *)this);
  _Stack_48 = boost::iterator_range_detail::
              iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              ::end(__begin0._M_current);
  while (bVar1 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    encode_latin1_to_utf8<char>(*pcVar2,__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> latin1_to_utf8(const boost::iterator_range<ForwardTraversalIterator> &latin1_string) {
  std::basic_string<CharT> utf8;

  for (auto code_point : latin1_string) {
    encode_latin1_to_utf8(code_point, utf8);
  }

  return utf8;
}